

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O2

AVisitor<hiberlite::KillChildren> * __thiscall
hiberlite::AVisitor<hiberlite::KillChildren>::operator&
          (AVisitor<hiberlite::KillChildren> *this,
          sql_nvp<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
          *nvp)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)nvp);
  divePrefix(this,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  walk<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
            (this,nvp->value);
  popScope(this);
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(sql_nvp<X> nvp)
{
	divePrefix(nvp.name);
		walk(nvp.value);
	pop();
	return *this;
}